

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.cpp
# Opt level: O0

string * __thiscall
antlr::RecognitionException::getFileLineColumnString_abi_cxx11_(RecognitionException *this)

{
  long lVar1;
  long in_RSI;
  string *in_RDI;
  string *fileLineColumnString;
  string local_108 [8];
  char *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  string local_e8 [32];
  string local_c8 [12];
  int in_stack_ffffffffffffff44;
  string *in_stack_ffffffffffffff48;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::__cxx11::string::operator=((string *)in_RDI,local_38);
    std::__cxx11::string::~string(local_38);
  }
  if (*(int *)(in_RSI + 0x48) != -1) {
    lVar1 = std::__cxx11::string::length();
    if (lVar1 == 0) {
      std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      std::__cxx11::string::operator=((string *)in_RDI,local_68);
      std::__cxx11::string::~string(local_68);
    }
    antlr::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
    std::__cxx11::string::operator=((string *)in_RDI,local_88);
    std::__cxx11::string::~string(local_88);
    if (*(int *)(in_RSI + 0x4c) != -1) {
      std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      antlr::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      std::__cxx11::string::operator=((string *)in_RDI,local_a8);
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::string::~string(local_c8);
    }
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::__cxx11::string::operator=((string *)in_RDI,local_e8);
    std::__cxx11::string::~string(local_e8);
  }
  std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::__cxx11::string::operator=((string *)in_RDI,local_108);
  std::__cxx11::string::~string(local_108);
  return in_RDI;
}

Assistant:

string RecognitionException::getFileLineColumnString() const
{
	ANTLR_USE_NAMESPACE(std)string fileLineColumnString;

	if ( fileName.length() > 0 )
		fileLineColumnString = fileName + ":";

	if ( line != -1 )
	{
		if ( fileName.length() == 0 )
			fileLineColumnString = fileLineColumnString + "line ";

		fileLineColumnString = fileLineColumnString + line;

		if ( column != -1 )
			fileLineColumnString = fileLineColumnString + ":" + column;

		fileLineColumnString = fileLineColumnString + ":";
	}

	fileLineColumnString = fileLineColumnString + " ";

	return fileLineColumnString;
}